

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

int rnndec_varmod(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  rnnvalue **pprVar2;
  rnndecvariant *prVar3;
  int iVar4;
  rnnenum *prVar5;
  rnndecvariant *prVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  prVar5 = rnn_findenum(ctx->db,varset);
  if (prVar5 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
    return 0;
  }
  iVar1 = prVar5->valsnum;
  if (0 < (long)iVar1) {
    pprVar2 = prVar5->vals;
    lVar8 = 0;
    do {
      iVar4 = strcasecmp(pprVar2[lVar8]->name,variant);
      if (iVar4 == 0) {
        lVar7 = 0;
        goto LAB_00107264;
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
  return 0;
  while (bVar9 = (ulong)(uint)ctx->varsnum - 1 != lVar7, lVar7 = lVar7 + 1, bVar9) {
LAB_00107264:
    prVar3 = ctx->vars[lVar7];
    if (prVar3->en == prVar5) break;
  }
  prVar6 = (rnndecvariant *)0x0;
  if (prVar3->en == prVar5) {
    prVar6 = prVar3;
  }
  prVar6->variant = (int)lVar8;
  return 1;
}

Assistant:

int rnndec_varmod(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = NULL;
			FINDARRAY(ctx->vars, ci, ci->en == en);
			ci->variant = i;
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}